

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O3

void __thiscall slang::ast::EvalContext::reportStack(EvalContext *this,Diagnostic *diag)

{
  uint uVar1;
  ulong uVar2;
  Diagnostic *this_00;
  pointer pFVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  FormatBuffer buffer;
  undefined1 *local_250;
  undefined8 local_248;
  undefined8 local_240;
  code *local_238;
  undefined1 local_230 [504];
  undefined1 local_38;
  
  uVar2 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
  uVar1 = (((this->astCtx).scope.ptr)->compilation->options).maxConstexprBacktrace;
  uVar4 = (ulong)uVar1;
  if (uVar4 == 0 || uVar2 <= uVar4) {
    local_248 = 0;
    local_238 = ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::
                grow;
    local_240 = 500;
    local_38 = 0;
    pFVar3 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    local_250 = local_230;
    for (lVar5 = uVar2 * 0x50; lVar5 != 0; lVar5 = lVar5 + -0x50) {
      reportFrame(diag,(Frame *)(&pFVar3[-1].temporaries._M_t._M_impl.field_0x0 + lVar5));
    }
    if (local_250 != local_230) {
      free(local_250);
    }
  }
  else {
    uVar6 = (ulong)(uVar1 >> 1);
    pFVar3 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    if (1 < uVar1) {
      lVar5 = uVar6 * -0x50;
      pFVar3 = pFVar3 + uVar2;
      do {
        pFVar3 = pFVar3 + -1;
        reportFrame(diag,pFVar3);
        lVar5 = lVar5 + 0x50;
      } while (lVar5 != 0);
      pFVar3 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
      uVar2 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
    }
    this_00 = Diagnostic::addNote(diag,(DiagCode)0x21000c,pFVar3[uVar2 + (-1 - uVar6)].callLocation)
    ;
    local_250 = (undefined1 *)
                ((this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len - uVar4);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&this_00->args,(unsigned_long *)&local_250);
    pFVar3 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    if ((pointer)(&pFVar3[uVar6].temporaries._M_t._M_impl.field_0x0 + (uVar1 & 1) * 0x50) != pFVar3)
    {
      lVar5 = uVar6 * 0x50 + (ulong)((uVar1 & 1) * 0x50);
      do {
        reportFrame(diag,(Frame *)(&pFVar3[-1].temporaries._M_t._M_impl.field_0x0 + lVar5));
        lVar5 = lVar5 + -0x50;
      } while (lVar5 != 0);
    }
  }
  return;
}

Assistant:

void EvalContext::reportStack(Diagnostic& diag) const {
    const size_t limit = getCompilation().getOptions().maxConstexprBacktrace;
    if (stack.size() <= limit || limit == 0) {
        FormatBuffer buffer;
        for (const Frame& frame : std::views::reverse(stack))
            reportFrame(diag, frame);
        return;
    }

    const ptrdiff_t start = ptrdiff_t(limit / 2);
    const ptrdiff_t end = start + ptrdiff_t(limit % 2);
    auto reversed = std::views::reverse(stack);
    for (auto it = reversed.begin(), itEnd = it + start; it != itEnd; it++)
        reportFrame(diag, *it);

    diag.addNote(diag::NoteSkippingFrames, (reversed.begin() + start)->callLocation)
        << stack.size() - limit;

    for (auto it = reversed.end() - end, itEnd = reversed.end(); it != itEnd; it++)
        reportFrame(diag, *it);
}